

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O1

cmCMakePath * __thiscall cmCMakePath::GetStem(cmCMakePath *__return_storage_ptr__,cmCMakePath *this)

{
  undefined1 auVar1 [16];
  string_type local_58;
  path local_38;
  
  auVar1 = std::filesystem::__cxx11::path::_M_find_extension();
  if (auVar1._8_8_ == 0 || auVar1._0_8_ == 0) {
    std::filesystem::__cxx11::path::path(&local_38);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_58,auVar1._0_8_);
    std::filesystem::__cxx11::path::path(&local_38,&local_58,auto_format);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  std::filesystem::__cxx11::path::path(&__return_storage_ptr__->Path,&local_38);
  std::filesystem::__cxx11::path::~path(&local_38);
  return __return_storage_ptr__;
}

Assistant:

cmCMakePath GetStem() const { return this->Path.stem(); }